

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AC3DImporter::InternReadFile
          (AC3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  char **in;
  pointer pMVar1;
  pointer __src;
  pointer __src_00;
  pointer __src_01;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  Logger *pLVar6;
  char *pcVar7;
  pointer this_00;
  aiNode *this_01;
  aiMesh **__dest;
  aiMaterial **__dest_00;
  aiLight **__dest_01;
  DeadlyImportError *pDVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong __n;
  allocator<char> local_27c;
  char msg [3];
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> materials;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> rootObjects;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> omaterials;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  vector<aiLight_*,_std::allocator<aiLight_*>_> lights;
  vector<char,_std::allocator<char>_> mBuffer2;
  undefined1 local_1a8 [12];
  aiColor3D local_19c;
  undefined8 local_18c;
  undefined1 local_184 [16];
  float local_174;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [19];
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"rb",(allocator<char> *)&materials);
  iVar4 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::~string((string *)local_1a8);
  if (stream == (IOStream *)0x0) {
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&materials,
                   "Failed to open AC3D file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&materials,
                   ".");
    DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_1a8);
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(stream,&mBuffer2,FORBID_EMPTY);
  pcVar2 = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  this->buffer = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  this->mNumMeshes = 0;
  this->lights = 0;
  this->groups = 0;
  this->polys = 0;
  this->worlds = 0;
  iVar4 = strncmp(mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,"AC3D",4);
  if (iVar4 != 0) {
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"AC3D: No valid AC3D file, magic sequence not found",
               (allocator<char> *)&materials);
    DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_1a8);
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = HexDigitToDecimal(pcVar2[4]);
  ASSIMP_itoa10(msg,3,uVar5);
  pLVar6 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [27])"AC3D file format version: ");
  std::operator<<((ostream *)local_1a8,msg);
  std::__cxx11::stringbuf::str();
  Logger::info(pLVar6,(char *)materials.
                              super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&materials);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  materials.
  super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  materials.
  super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.
  super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  reserve(&materials,5);
  rootObjects.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rootObjects.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rootObjects.
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::reserve
            (&rootObjects,5);
  in = &this->buffer;
  lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->mLights = &lights;
LAB_003d7613:
  bVar3 = GetNextLine(this);
  if (!bVar3) {
    if ((rootObjects.
         super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         rootObjects.
         super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
         ._M_impl.super__Vector_impl_data._M_finish) || (uVar5 = this->mNumMeshes, uVar5 == 0)) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,"AC3D: No meshes have been loaded",(allocator<char> *)&meshes);
      DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_1a8);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (materials.
        super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        materials.
        super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar6 = DefaultLogger::get();
      Logger::warn(pLVar6,"AC3D: No material has been found");
      local_1a8._0_8_ = (ai_real *)0x3f19999a3f19999a;
      local_1a8._8_4_ = 0.6;
      local_19c.r = 0.0;
      local_19c.g = 0.0;
      stack0xfffffffffffffe6c = 0;
      local_18c._0_4_ = 0.0;
      local_18c._4_4_ = 0.0;
      local_184._0_4_ = 1.0;
      local_184._4_4_ = 1.0;
      local_184._8_8_ = 0x3f800000;
      local_174 = 0.0;
      local_170._M_p = (pointer)local_160;
      local_168 = 0;
      local_160[0]._M_local_buf[0] = '\0';
      std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
      emplace_back<Assimp::AC3DImporter::Material>(&materials,(Material *)local_1a8);
      std::__cxx11::string::~string((string *)&local_170);
      uVar5 = this->mNumMeshes;
    }
    uVar5 = uVar5 + (uVar5 >> 2) + 1;
    this->mNumMeshes = uVar5;
    meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&meshes,(ulong)uVar5);
    omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
    reserve(&materials,(ulong)this->mNumMeshes);
    this_00 = rootObjects.
              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)rootObjects.
              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)rootObjects.
              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
              ._M_impl.super__Vector_impl_data._M_start != 0xe0) {
      this_00 = (pointer)operator_new(0xe0);
      Object::Object(this_00);
    }
    this_01 = ConvertObjectSection(this,this_00,&meshes,&omaterials,&materials,(aiNode *)0x0);
    pScene->mRootNode = this_01;
    if ((long)rootObjects.
              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)rootObjects.
              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
              ._M_impl.super__Vector_impl_data._M_start != 0xe0) {
      Object::~Object(this_00);
      operator_delete(this_00,0xe0);
      this_01 = pScene->mRootNode;
    }
    iVar4 = strncmp((this_01->mName).data,"Node",4);
    if (iVar4 == 0) {
      aiString::Set(&this_01->mName,"<AC3DWorld>");
    }
    __src_00 = meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pScene->mNumMeshes =
           (uint)((ulong)((long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar12 = (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x7fffffff8;
      __dest = (aiMesh **)operator_new__(uVar12);
      pScene->mMeshes = __dest;
      memcpy(__dest,__src_00,uVar12);
      __src = omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      pScene->mNumMaterials =
           (uint)((ulong)((long)omaterials.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)omaterials.
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar12 = (long)omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
      __dest_00 = (aiMaterial **)operator_new__(uVar12);
      pScene->mMaterials = __dest_00;
      memcpy(__dest_00,__src,uVar12);
      __src_01 = lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar12 = (long)lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      pScene->mNumLights = (uint)uVar12;
      __n = (long)lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (__n != 0) {
        __dest_01 = (aiLight **)operator_new__(-(ulong)(uVar12 >> 0x3d != 0) | __n);
        pScene->mLights = __dest_01;
        memcpy(__dest_01,__src_01,__n);
      }
      std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
                (&omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
      std::_Vector_base<aiLight_*,_std::allocator<aiLight_*>_>::~_Vector_base
                (&lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>);
      std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
      ~vector(&rootObjects);
      std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
      ~vector(&materials);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&mBuffer2.super__Vector_base<char,_std::allocator<char>_>);
      (*stream->_vptr_IOStream[1])();
      return;
    }
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"An unknown error occurred during converting",&local_27c);
    DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_1a8);
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = TokenMatch<char_const>(in,"MATERIAL",8);
  if (!bVar3) goto LAB_003d7b37;
  local_1a8._0_8_ = (ai_real *)0x3f19999a3f19999a;
  local_1a8._8_4_ = 0.6;
  local_19c.r = 0.0;
  local_19c.g = 0.0;
  stack0xfffffffffffffe6c = 0;
  local_18c._0_4_ = 0.0;
  local_18c._4_4_ = 0.0;
  local_184._0_4_ = 1.0;
  local_184._4_4_ = 1.0;
  local_184._8_8_ = 0x3f800000;
  local_174 = 0.0;
  local_170._M_p = (pointer)local_160;
  local_168 = 0;
  local_160[0]._M_local_buf[0] = '\0';
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  emplace_back<Assimp::AC3DImporter::Material>(&materials,(Material *)local_1a8);
  std::__cxx11::string::~string((string *)&local_170);
  pMVar1 = materials.
           super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = SkipSpaces<char>(in);
  if (!bVar3) goto LAB_003d7ace;
  if (**in != '\"') goto LAB_003d779e;
  pbVar11 = (byte *)(*in + 1);
  pbVar9 = pbVar11;
LAB_003d76ec:
  *in = (char *)pbVar9;
  uVar12 = (ulong)*pbVar9;
  if (0x22 < uVar12) {
LAB_003d770a:
    pbVar9 = pbVar9 + 1;
    goto LAB_003d76ec;
  }
  if ((0x3401UL >> (uVar12 & 0x3f) & 1) == 0) {
    if (uVar12 == 0x22) goto LAB_003d774d;
    goto LAB_003d770a;
  }
  pLVar6 = DefaultLogger::get();
  Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL in string");
  std::__cxx11::string::assign((char *)&pMVar1[-1].name);
  pbVar9 = (byte *)*in;
  if ((*pbVar9 < 0xe) && ((0x3401U >> (*pbVar9 & 0x1f) & 1) != 0)) goto LAB_003d7613;
LAB_003d774d:
  local_1a8._0_8_ = &local_19c.g;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,pbVar11,pbVar11 + (uint)((int)pbVar9 - (int)pbVar11));
  std::__cxx11::string::operator=((string *)&pMVar1[-1].name,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  *in = *in + 1;
  bVar3 = SkipSpaces<char>(in);
  if (!bVar3) {
    pLVar6 = DefaultLogger::get();
    Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL");
    goto LAB_003d7613;
  }
LAB_003d779e:
  bVar3 = SkipSpaces<char>(in);
  if (bVar3) {
    pcVar7 = *in;
    if ((((*pcVar7 != 'r') || (pcVar7[1] != 'g')) || (pcVar7[2] != 'b')) ||
       ((pcVar7[3] != '\t' && (pcVar7[3] != ' ')))) {
      pLVar6 = DefaultLogger::get();
      pcVar7 = "AC3D: Unexpexted token. rgb was expected.";
      goto LAB_003d7ada;
    }
    *in = pcVar7 + 4;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      bVar3 = SkipSpaces<char>(in);
      if (bVar3) {
        pcVar7 = fast_atoreal_move<float>(*in,(float *)((long)&pMVar1[-1].rgb.r + lVar10),true);
        *in = pcVar7;
      }
      else {
        pLVar6 = DefaultLogger::get();
        Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL");
      }
    }
    bVar3 = SkipSpaces<char>(in);
    if (bVar3) {
      pcVar7 = *in;
      if (((*pcVar7 != 'a') || (pcVar7[1] != 'm')) ||
         ((pcVar7[2] != 'b' || ((pcVar7[3] != '\t' && (pcVar7[3] != ' ')))))) {
        pLVar6 = DefaultLogger::get();
        pcVar7 = "AC3D: Unexpexted token. amb was expected.";
        goto LAB_003d7ada;
      }
      *in = pcVar7 + 4;
      for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
        bVar3 = SkipSpaces<char>(in);
        if (bVar3) {
          pcVar7 = fast_atoreal_move<float>(*in,(float *)((long)pMVar1 + lVar10 + -0x4c),true);
          *in = pcVar7;
        }
        else {
          pLVar6 = DefaultLogger::get();
          Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL");
        }
      }
      bVar3 = SkipSpaces<char>(in);
      if (bVar3) {
        pcVar7 = *in;
        iVar4 = strncmp(pcVar7,"emis",4);
        if ((iVar4 != 0) || ((pcVar7[4] != '\t' && (pcVar7[4] != ' ')))) {
          pLVar6 = DefaultLogger::get();
          pcVar7 = "AC3D: Unexpexted token. emis was expected.";
          goto LAB_003d7ada;
        }
        *in = pcVar7 + 5;
        for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
          bVar3 = SkipSpaces<char>(in);
          if (bVar3) {
            pcVar7 = fast_atoreal_move<float>(*in,(float *)((long)pMVar1 + lVar10 + -0x40),true);
            *in = pcVar7;
          }
          else {
            pLVar6 = DefaultLogger::get();
            Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL");
          }
        }
        bVar3 = SkipSpaces<char>(in);
        if (bVar3) {
          pcVar7 = *in;
          iVar4 = strncmp(pcVar7,"spec",4);
          if ((iVar4 != 0) || ((pcVar7[4] != '\t' && (pcVar7[4] != ' ')))) {
            pLVar6 = DefaultLogger::get();
            pcVar7 = "AC3D: Unexpexted token. spec was expected.";
            goto LAB_003d7ada;
          }
          *in = pcVar7 + 5;
          for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
            bVar3 = SkipSpaces<char>(in);
            if (bVar3) {
              pcVar7 = fast_atoreal_move<float>(*in,(float *)((long)pMVar1 + lVar10 + -0x34),true);
              *in = pcVar7;
            }
            else {
              pLVar6 = DefaultLogger::get();
              Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL");
            }
          }
          bVar3 = SkipSpaces<char>(in);
          if (bVar3) {
            pcVar7 = *in;
            if ((((*pcVar7 != 's') || (pcVar7[1] != 'h')) || (pcVar7[2] != 'i')) ||
               ((pcVar7[3] != '\t' && (pcVar7[3] != ' ')))) {
              pLVar6 = DefaultLogger::get();
              pcVar7 = "AC3D: Unexpexted token. shi was expected.";
              goto LAB_003d7ada;
            }
            *in = pcVar7 + 4;
            bVar3 = SkipSpaces<char>(in);
            if (bVar3) {
              pcVar7 = fast_atoreal_move<float>(*in,&pMVar1[-1].shin,true);
              *in = pcVar7;
            }
            else {
              pLVar6 = DefaultLogger::get();
              Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL");
            }
            bVar3 = SkipSpaces<char>(in);
            if (bVar3) {
              pcVar7 = *in;
              iVar4 = strncmp(pcVar7,"trans",5);
              if ((iVar4 == 0) && ((pcVar7[5] == '\t' || (pcVar7[5] == ' ')))) {
                *in = pcVar7 + 6;
                bVar3 = SkipSpaces<char>(in);
                if (bVar3) {
                  pcVar7 = fast_atoreal_move<float>(*in,&pMVar1[-1].trans,true);
                  *in = pcVar7;
                }
                else {
                  pLVar6 = DefaultLogger::get();
                  Logger::error(pLVar6,"AC3D: Unexpected EOF/EOL");
                }
LAB_003d7b37:
                LoadObjectSection(this,&rootObjects);
                goto LAB_003d7613;
              }
              pLVar6 = DefaultLogger::get();
              pcVar7 = "AC3D: Unexpexted token. trans was expected.";
              goto LAB_003d7ada;
            }
          }
        }
      }
    }
  }
LAB_003d7ace:
  pLVar6 = DefaultLogger::get();
  pcVar7 = "AC3D: Unexpected EOF/EOL";
LAB_003d7ada:
  Logger::error(pLVar6,pcVar7);
  goto LAB_003d7613;
}

Assistant:

void AC3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open AC3D file " + pFile + ".");

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);

    buffer = &mBuffer2[0];
    mNumMeshes = 0;

    lights = polys = worlds = groups = 0;

    if (::strncmp(buffer,"AC3D",4)) {
        throw DeadlyImportError("AC3D: No valid AC3D file, magic sequence not found");
    }

    // print the file format version to the console
    unsigned int version = HexDigitToDecimal( buffer[4] );
    char msg[3];
    ASSIMP_itoa10(msg,3,version);
    ASSIMP_LOG_INFO_F("AC3D file format version: ", msg);

    std::vector<Material> materials;
    materials.reserve(5);

    std::vector<Object> rootObjects;
    rootObjects.reserve(5);

    std::vector<aiLight*> lights;
    mLights = & lights;

    while (GetNextLine())
    {
        if (TokenMatch(buffer,"MATERIAL",8))
        {
            materials.push_back(Material());
            Material& mat = materials.back();

            // manually parse the material ... sscanf would use the buldin atof ...
            // Format: (name) rgb %f %f %f  amb %f %f %f  emis %f %f %f  spec %f %f %f  shi %d  trans %f

            AI_AC_SKIP_TO_NEXT_TOKEN();
            if ('\"' == *buffer)
            {
                AI_AC_GET_STRING(mat.name);
                AI_AC_SKIP_TO_NEXT_TOKEN();
            }

            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("rgb",3,3,&mat.rgb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("amb",3,3,&mat.amb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("emis",4,3,&mat.emis);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("spec",4,3,&mat.spec);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("shi",3,1,&mat.shin);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("trans",5,1,&mat.trans);
        }
        LoadObjectSection(rootObjects);
    }

    if (rootObjects.empty() || !mNumMeshes)
    {
        throw DeadlyImportError("AC3D: No meshes have been loaded");
    }
    if (materials.empty())
    {
        ASSIMP_LOG_WARN("AC3D: No material has been found");
        materials.push_back(Material());
    }

    mNumMeshes += (mNumMeshes>>2u) + 1;
    std::vector<aiMesh*> meshes;
    meshes.reserve(mNumMeshes);

    std::vector<aiMaterial*> omaterials;
    materials.reserve(mNumMeshes);

    // generate a dummy root if there are multiple objects on the top layer
    Object* root;
    if (1 == rootObjects.size())
        root = &rootObjects[0];
    else
    {
        root = new Object();
    }

    // now convert the imported stuff to our output data structure
    pScene->mRootNode = ConvertObjectSection(*root,meshes,omaterials,materials);
    if (1 != rootObjects.size())delete root;

    if (!::strncmp( pScene->mRootNode->mName.data, "Node", 4))
        pScene->mRootNode->mName.Set("<AC3DWorld>");

    // copy meshes
    if (meshes.empty())
    {
        throw DeadlyImportError("An unknown error occurred during converting");
    }
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    ::memcpy(pScene->mMeshes,&meshes[0],pScene->mNumMeshes*sizeof(void*));

    // copy materials
    pScene->mNumMaterials = (unsigned int)omaterials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&omaterials[0],pScene->mNumMaterials*sizeof(void*));

    // copy lights
    pScene->mNumLights = (unsigned int)lights.size();
    if (lights.size())
    {
        pScene->mLights = new aiLight*[lights.size()];
        ::memcpy(pScene->mLights,&lights[0],lights.size()*sizeof(void*));
    }
}